

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

void append_entry(char **p,char *prefix,wchar_t tag,char *name,wchar_t perm,wchar_t id)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (prefix != (char *)0x0) {
    strcpy(*p,prefix);
    pcVar4 = *p;
    sVar3 = strlen(pcVar4);
    *p = pcVar4 + sVar3;
  }
  switch(tag) {
  case L'✒':
    id = L'\xffffffff';
    name = (char *)0x0;
  case L'✑':
    builtin_strncpy(*p,"user",5);
    break;
  case L'✔':
    id = L'\xffffffff';
    name = (char *)0x0;
  case L'✓':
    builtin_strncpy(*p,"group",6);
    break;
  case L'✕':
    builtin_strncpy(*p,"mask",5);
    goto LAB_001544a7;
  case L'✖':
    builtin_strncpy(*p,"other",6);
LAB_001544a7:
    name = (char *)0x0;
    id = L'\xffffffff';
  }
  pcVar4 = *p;
  sVar3 = strlen(pcVar4);
  pcVar4 = pcVar4 + sVar3;
  *p = pcVar4 + 1;
  *pcVar4 = ':';
  if (name == (char *)0x0) {
    if ((tag & 0xfffffffdU) == 0x2711) {
      append_id(p,id);
      id = L'\xffffffff';
    }
  }
  else {
    strcpy(*p,name);
    pcVar4 = *p;
    sVar3 = strlen(pcVar4);
    *p = pcVar4 + sVar3;
  }
  pcVar4 = *p;
  *p = pcVar4 + 1;
  *pcVar4 = ':';
  cVar1 = '-';
  cVar2 = 'r';
  if ((perm & 0x124U) == 0) {
    cVar2 = cVar1;
  }
  pcVar4 = *p;
  *p = pcVar4 + 1;
  *pcVar4 = cVar2;
  cVar2 = 'w';
  if ((perm & 0x92U) == 0) {
    cVar2 = cVar1;
  }
  pcVar4 = *p;
  *p = pcVar4 + 1;
  *pcVar4 = cVar2;
  cVar2 = 'x';
  if ((perm & 0x49U) == 0) {
    cVar2 = cVar1;
  }
  pcVar4 = *p;
  *p = pcVar4 + 1;
  *pcVar4 = cVar2;
  if (id != L'\xffffffff') {
    pcVar4 = *p;
    *p = pcVar4 + 1;
    *pcVar4 = ':';
    append_id(p,id);
  }
  **p = '\0';
  return;
}

Assistant:

static void
append_entry(char **p, const char *prefix, int tag,
    const char *name, int perm, int id)
{
	if (prefix != NULL) {
		strcpy(*p, prefix);
		*p += strlen(*p);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		name = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		strcpy(*p, "user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		name = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		strcpy(*p, "group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		strcpy(*p, "mask");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		strcpy(*p, "other");
		name = NULL;
		id = -1;
		break;
	}
	*p += strlen(*p);
	*(*p)++ = ':';
	if (name != NULL) {
		strcpy(*p, name);
		*p += strlen(*p);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id(p, id);
		id = -1;
	}
	*(*p)++ = ':';
	*(*p)++ = (perm & 0444) ? 'r' : '-';
	*(*p)++ = (perm & 0222) ? 'w' : '-';
	*(*p)++ = (perm & 0111) ? 'x' : '-';
	if (id != -1) {
		*(*p)++ = ':';
		append_id(p, id);
	}
	**p = '\0';
}